

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O3

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
          *m,PositionMeasurement<float> *z)

{
  float *this_00;
  float *cov;
  float fVar1;
  float fVar2;
  undefined1 local_a0 [8];
  SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> sigmaMeasurementPoints;
  Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> P_yy;
  undefined1 local_50 [8];
  KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> K;
  PositionMeasurement<float> y;
  
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeSigmaPointMeasurements<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this,m,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_a0);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._0_8_ =
       this + 0xc;
  this_00 = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array + 4
  ;
  local_50 = (undefined1  [8])local_a0;
  Vector<float,2>::
  Vector<Eigen::Product<Eigen::Matrix<float,2,7,0,2,7>,Eigen::Matrix<float,7,1,0,7,1>,0>>
            ((Vector<float,_2> *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_Eigen::Matrix<float,_7,_1,_0,_7,_1>,_0>_>
              *)local_50);
  cov = sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage
        .m_data.array + 0xc;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_a0,
             &(m->super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>).P,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)this_00,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_a0,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_50);
  fVar2 = (z->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] -
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4];
  fVar1 = (z->super_Vector<float,_2>).super_Matrix<float,_2,_1>.
          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] -
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5];
  *(float *)this =
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] *
       fVar1 + (float)local_50._0_4_ * fVar2 + *(float *)this;
  *(float *)(this + 4) =
       K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] *
       fVar1 + (float)local_50._4_4_ * fVar2 + *(float *)(this + 4);
  *(float *)(this + 8) =
       fVar1 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               [3] +
       fVar2 * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               [0] + *(float *)(this + 8);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_50,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov);
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }